

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  long lVar3;
  long lVar4;
  long **pplVar5;
  long lVar6;
  undefined1 *puVar7;
  string shader_source;
  long *local_58 [2];
  long local_48 [2];
  ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  lVar6 = 0;
  local_38 = this;
  do {
    lVar3 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar3 = 0x222cb38;
      lVar4 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::ES::var_types + lVar6 * 4) <= *(int *)(lVar4 + 0x20)) {
          lVar3 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 +
                         (ulong)(*(int *)(lVar4 + 0x20) <
                                *(int *)(Interface::ES::var_types + lVar6 * 4)) * 8);
      } while (lVar4 != 0);
    }
    lVar4 = 0x222cb38;
    if ((lVar3 != 0x222cb38) &&
       (lVar4 = lVar3, *(int *)(Interface::ES::var_types + lVar6 * 4) < *(int *)(lVar3 + 0x20))) {
      lVar4 = 0x222cb38;
    }
    if (lVar4 == 0x222cb38) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xdb3);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,shader_start_abi_cxx11_,DAT_02227518 + shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar4 + 0x88));
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::append((char *)local_58);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)local_58);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)local_58,*puVar1);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xdac);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)local_58,shader_end_abi_cxx11_);
    puVar7 = empty_string_abi_cxx11_;
    pplVar5 = (long **)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      pplVar5 = local_58;
      break;
    case VERTEX_SHADER_TYPE:
      puVar7 = (undefined1 *)local_58;
      goto LAB_00b3cd9e;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
LAB_00b3cd9e:
      pplVar5 = (long **)default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xdaf);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_38->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_38,puVar7,pplVar5,1,0);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x1c) {
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsEquality1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start;

			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] x = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n";
			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] y = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}